

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

ON_XMLNode * __thiscall
ON_XMLNodePrivate::GetNodeAtPath(ON_XMLNodePrivate *this,wchar_t *wszPath,bool bCreate)

{
  int iVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  long lVar4;
  undefined4 extraout_var;
  wchar_t *s2;
  ON_XMLNode *pOVar5;
  wchar_t __wc;
  ulong uVar6;
  ChildIterator it;
  wchar_t wsz [261];
  ChildIterator CStack_458;
  wchar_t local_448 [260];
  undefined4 local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (wszPath != (wchar_t *)0x0) {
    __wc = *wszPath;
    while (__wc != L'\0') {
      iVar1 = iswspace(__wc);
      if ((iVar1 == 0) && (*wszPath != L'/')) {
        if (*wszPath != L'\0') {
          wcsncpy(local_448,wszPath,0x104);
          local_38 = 0;
          sVar2 = wcslen(local_448);
          if ((int)(uint)sVar2 < 1) goto LAB_006829c1;
          uVar6 = (ulong)((uint)sVar2 & 0x7fffffff) + 1;
          goto LAB_006829a1;
        }
        break;
      }
      pwVar3 = wszPath + 1;
      wszPath = wszPath + 1;
      __wc = *pwVar3;
    }
  }
  goto LAB_006829f6;
  while( true ) {
    local_448[uVar6 - 2] = L'\0';
    uVar6 = uVar6 - 1;
    if (uVar6 < 2) break;
LAB_006829a1:
    iVar1 = iswspace(local_448[uVar6 - 2]);
    if (iVar1 == 0) break;
  }
LAB_006829c1:
  if (local_448[0] != L'\0') {
    pwVar3 = wcschr(local_448,L'/');
    uVar6 = (long)pwVar3 - (long)local_448;
    if ((int)(~uVar6 >> 2) == 0 || pwVar3 == (wchar_t *)0x0) {
      pwVar3 = (wchar_t *)0x0;
    }
    else {
      lVar4 = (long)(int)(uVar6 >> 2);
      pwVar3 = local_448 + lVar4 + 1;
      local_448[lVar4] = L'\0';
    }
    (*this->m_node->_vptr_ON_XMLNode[0x2c])(&CStack_458);
    do {
      pOVar5 = (CStack_458._private)->_current;
      if (pOVar5 == (ON_XMLNode *)0x0) {
        if (!bCreate) {
          pOVar5 = (ON_XMLNode *)0x0;
          goto LAB_00682ac2;
        }
        pOVar5 = (ON_XMLNode *)operator_new(0xe8);
        ON_XMLNode::ON_XMLNode(pOVar5,local_448);
        bCreate = true;
        AttachChildNode(this,pOVar5);
        break;
      }
      (CStack_458._private)->_current = pOVar5->_private->m_next_sibling;
      iVar1 = (*pOVar5->_vptr_ON_XMLNode[3])(pOVar5);
      s2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)CONCAT44(extraout_var,iVar1));
      iVar1 = on_wcsicmp(local_448,s2);
    } while (iVar1 != 0);
    pOVar5 = GetNodeAtPath(pOVar5->_private,pwVar3,bCreate);
LAB_00682ac2:
    ON_XMLNode::ChildIterator::~ChildIterator(&CStack_458);
    goto LAB_006829f9;
  }
LAB_006829f6:
  pOVar5 = this->m_node;
LAB_006829f9:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return pOVar5;
}

Assistant:

ON_XMLNode* ON_XMLNodePrivate::GetNodeAtPath(const wchar_t* wszPath, bool bCreate)
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  // Forward slash "/" is the separator.

  if (nullptr == wszPath)
    return &m_node;

  const wchar_t* p = wszPath;
  while (*p != 0)
  {
    if (!iswspace(*p) && *p != L'/')
      break;
    p++;
  }

  if (*p == 0)
    return &m_node; // The input string was empty.

  constexpr int maxBuf = 260;
  wchar_t wsz[maxBuf+1];
  wcsncpy(wsz, p, maxBuf);
  wsz[maxBuf] = 0;

  // Now right trim out the white space.
  const int iLength = (int)wcslen(wsz);

  for (int i = iLength - 1; i >= 0; i--)
  {
    if (iswspace(wsz[i]))
      wsz[i] = 0;
    else
      break;
  }

  // Check for a resultant empty string.
  if (*wsz == 0)
    return &m_node;

  const wchar_t* pNext = nullptr;
  const wchar_t* pstr = wcschr(wsz, L'/');

  const int pos = (pstr != nullptr) ? (int)(pstr - wsz) : -1;
  if (-1 != pos)
  {
    // sNext is the rest of the string that we're going to recurse through.
    pNext = wsz + pos + 1;
    wsz[pos] = 0;
  }

  auto it = m_node.GetChildIterator();
  ON_XMLNode* pChild = nullptr;
  while (nullptr != (pChild = it.GetNextChild()))
  {
    if (on_wcsicmp(wsz, pChild->TagName()) == 0)
    {
      return pChild->_private->GetNodeAtPath(pNext, bCreate);
    }
  }

  // The child was not found.
  if (bCreate)
  {
    return AttachChildNode(new ON_XMLNode(wsz))->_private->GetNodeAtPath(pNext, bCreate);
  }

  return nullptr;
}